

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_n_binary_ops_template.h
# Opt level: O3

bool __thiscall
test_uintwide_t_n_binary_ops_template<24U,_unsigned_char,_void>::do_test
          (test_uintwide_t_n_binary_ops_template<24U,_unsigned_char,_void> *this,size_t rounds)

{
  anon_class_32_4_006e9c57 parallel_function;
  anon_class_32_4_006e9c57 parallel_function_00;
  anon_class_32_4_006e9c57 parallel_function_01;
  anon_class_32_4_006e9c57 parallel_function_02;
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  size_t sVar4;
  byte bVar5;
  bool result_is_ok;
  atomic_flag test_lock;
  atomic_flag *in_stack_ffffffffffffffa0;
  byte local_53 [3];
  byte *local_50;
  byte *pbStack_48;
  test_uintwide_t_n_binary_ops_template<24U,_unsigned_char,_void> *local_40;
  size_t local_38;
  
  if (rounds != 0) {
    sVar4 = 0;
    local_53[2] = true;
    local_38 = rounds;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"initialize()       boost compare with uintwide_t: round ",
                 0x38);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",  digits2: ",0xc);
      (*(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
        _vptr_test_uintwide_t_n_base[2])(this);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      (*(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
        _vptr_test_uintwide_t_n_base[3])(this);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"test_binary_add()  boost compare with uintwide_t: round ",
                 0x38);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",  digits2: ",0xc);
      (*(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
        _vptr_test_uintwide_t_n_base[2])(this);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      local_53[0] = 1;
      local_53[1] = 0;
      local_50 = local_53 + 1;
      parallel_function.u_boost =
           (number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>
            **)local_53;
      parallel_function.u_local = (uintwide_t<24U,_unsigned_char,_void,_false> **)local_50;
      parallel_function.distribution = (distribution_type *)this;
      parallel_function.rnd_lock = in_stack_ffffffffffffffa0;
      pbStack_48 = local_53;
      local_40 = this;
      my_concurrency::
      parallel_for<unsigned_long,test_uintwide_t_n_binary_ops_template<24u,unsigned_char,void>::test_binary_add()const::_lambda(unsigned_long)_1_>
                (0,(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
                   number_of_cases,parallel_function);
      bVar5 = local_53[0];
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"test_binary_sub()  boost compare with uintwide_t: round ",
                 0x38);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",  digits2: ",0xc);
      (*(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
        _vptr_test_uintwide_t_n_base[2])(this);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      local_53[0] = 1;
      local_53[1] = 0;
      local_50 = local_53 + 1;
      parallel_function_00.u_boost =
           (number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>
            **)local_53;
      parallel_function_00.u_local = (uintwide_t<24U,_unsigned_char,_void,_false> **)local_50;
      parallel_function_00.distribution = (distribution_type *)this;
      parallel_function_00.rnd_lock = in_stack_ffffffffffffffa0;
      pbStack_48 = local_53;
      local_40 = this;
      my_concurrency::
      parallel_for<unsigned_long,test_uintwide_t_n_binary_ops_template<24u,unsigned_char,void>::test_binary_sub()const::_lambda(unsigned_long)_1_>
                (0,(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
                   number_of_cases,parallel_function_00);
      bVar5 = bVar5 & local_53[0];
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"test_binary_mul()  boost compare with uintwide_t: round ",
                 0x38);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",  digits2: ",0xc);
      (*(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
        _vptr_test_uintwide_t_n_base[2])(this);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      local_53[0] = 1;
      local_53[1] = 0;
      local_50 = local_53 + 1;
      parallel_function_01.u_boost =
           (number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>
            **)local_53;
      parallel_function_01.u_local = (uintwide_t<24U,_unsigned_char,_void,_false> **)local_50;
      parallel_function_01.distribution = (distribution_type *)this;
      parallel_function_01.rnd_lock = in_stack_ffffffffffffffa0;
      pbStack_48 = local_53;
      local_40 = this;
      my_concurrency::
      parallel_for<unsigned_long,test_uintwide_t_n_binary_ops_template<24u,unsigned_char,void>::test_binary_mul()const::_lambda(unsigned_long)_1_>
                (0,(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
                   number_of_cases,parallel_function_01);
      bVar5 = bVar5 & local_53[0];
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"test_binary_div()  boost compare with uintwide_t: round ",
                 0x38);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",  digits2: ",0xc);
      (*(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
        _vptr_test_uintwide_t_n_base[2])(this);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      bVar1 = test_binary_div(this);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"test_binary_mod()  boost compare with uintwide_t: round ",
                 0x38);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",  digits2: ",0xc);
      (*(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
        _vptr_test_uintwide_t_n_base[2])(this);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      bVar2 = test_binary_mod(this);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"test_binary_sqrt() boost compare with uintwide_t: round ",
                 0x38);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",  digits2: ",0xc);
      (*(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
        _vptr_test_uintwide_t_n_base[2])(this);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      local_53[0] = 1;
      local_53[1] = 0;
      local_50 = local_53 + 1;
      pbStack_48 = local_53;
      parallel_function_02.u_boost =
           (number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>
            **)pbStack_48;
      parallel_function_02.u_local = (uintwide_t<24U,_unsigned_char,_void,_false> **)local_50;
      parallel_function_02.distribution = (distribution_type *)this;
      parallel_function_02.rnd_lock = in_stack_ffffffffffffffa0;
      local_40 = this;
      my_concurrency::
      parallel_for<unsigned_long,test_uintwide_t_n_binary_ops_template<24u,unsigned_char,void>::test_binary_sqrt()const::_lambda(unsigned_long)_1_>
                (0,(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
                   number_of_cases,parallel_function_02);
      local_53[2] = local_53[2] & (bVar2 && bVar1) & bVar5 & local_53[0];
      sVar4 = sVar4 + 1;
    } while (local_38 != sVar4);
    return (bool)local_53[2];
  }
  return true;
}

Assistant:

auto do_test(std::size_t rounds) -> bool override
    {
      bool result_is_ok = true;

      for(std::size_t i = 0U; i < rounds; ++i)
      {
        std::cout << "initialize()       boost compare with uintwide_t: round " << i << ",  digits2: " << this->get_digits2() << std::endl;
        this->initialize();

        std::cout << "test_binary_add()  boost compare with uintwide_t: round " << i << ",  digits2: " << this->get_digits2() << std::endl;
        result_is_ok = (test_binary_add() && result_is_ok);

        std::cout << "test_binary_sub()  boost compare with uintwide_t: round " << i << ",  digits2: " << this->get_digits2() << std::endl;
        result_is_ok = (test_binary_sub() && result_is_ok);

        std::cout << "test_binary_mul()  boost compare with uintwide_t: round " << i << ",  digits2: " << this->get_digits2() << std::endl;
        result_is_ok = (test_binary_mul() && result_is_ok);

        std::cout << "test_binary_div()  boost compare with uintwide_t: round " << i << ",  digits2: " << this->get_digits2() << std::endl;
        result_is_ok = (test_binary_div() && result_is_ok);

        std::cout << "test_binary_mod()  boost compare with uintwide_t: round " << i << ",  digits2: " << this->get_digits2() << std::endl;
        result_is_ok = (test_binary_mod() && result_is_ok);

        std::cout << "test_binary_sqrt() boost compare with uintwide_t: round " << i << ",  digits2: " << this->get_digits2() << std::endl;
        result_is_ok = (test_binary_sqrt() && result_is_ok);
      }

      return result_is_ok;
    }